

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_multiple.h
# Opt level: O0

bool __thiscall
density::detail::
LFQueue_Head<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
::Consume::begin_iteration
          (Consume *this,
          LFQueue_Head<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          *i_queue)

{
  bool bVar1;
  uintptr_t uVar2;
  __pointer_type local_28;
  ControlBlock *head;
  LFQueue_Head<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
  *i_queue_local;
  Consume *this_local;
  
  local_28 = std::atomic<density::detail::LfQueueControl_*>::load
                       (&i_queue->m_head,memory_order_seq_cst);
  if ((local_28 == (__pointer_type)0x0) &&
     (local_28 = init_head(i_queue), local_28 == (ControlBlock *)0x0)) {
    this->m_next_ptr = 0;
  }
  else {
    while (bVar1 = LFQueue_Base<density::runtime_type<>,_density_tests::move_only_void_allocator,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                   ::same_page(this->m_control,local_28), ((bVar1 ^ 0xffU) & 1) != 0) {
      basic_default_allocator<65536UL>::pin_page
                ((basic_default_allocator<65536UL> *)i_queue,local_28);
      if (this->m_control != (ControlBlock *)0x0) {
        basic_default_allocator<65536UL>::unpin_page
                  ((basic_default_allocator<65536UL> *)i_queue,this->m_control);
      }
      this->m_control = local_28;
      local_28 = std::atomic<density::detail::LfQueueControl_*>::load
                           (&i_queue->m_head,memory_order_seq_cst);
    }
    this->m_queue = i_queue;
    this->m_control = local_28;
    uVar2 = raw_atomic_load(&this->m_control->m_next,memory_order_seq_cst);
    this->m_next_ptr = uVar2;
    bVar1 = empty(this);
    if ((!bVar1) && (this->m_next_ptr < 0x10000)) {
      density_tests::detail::assert_failed<>
                ("empty() || m_next_ptr >= ALLOCATOR_TYPE::page_alignment",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
                 ,0xb4);
    }
  }
  return true;
}

Assistant:

bool begin_iteration(LFQueue_Head * i_queue) noexcept
                {
                    DENSITY_ASSUME_ALIGNED(m_control, Base::s_alloc_granularity);

                    ControlBlock * head = i_queue->m_head.load();
                    DENSITY_ASSUME_ALIGNED(head, Base::s_alloc_granularity);

                    if (head == nullptr)
                    {
                        head = init_head(i_queue);
                        if (head == nullptr)
                        {
                            m_next_ptr = 0;
                            return true;
                        }
                    }

                    while (!Base::same_page(m_control, head))
                    {
                        DENSITY_ASSUME(m_control != head);

                        i_queue->ALLOCATOR_TYPE::pin_page(head);

                        if (m_control != nullptr)
                        {
                            i_queue->ALLOCATOR_TYPE::unpin_page(m_control);
                        }

                        m_control = head;

                        head = i_queue->m_head.load();
                        DENSITY_ASSUME_ALIGNED(head, Base::s_alloc_granularity);
                    }

                    m_queue    = i_queue;
                    m_control  = static_cast<ControlBlock *>(head);
                    m_next_ptr = raw_atomic_load(&m_control->m_next, mem_relaxed);
                    DENSITY_ASSERT_INTERNAL(
                      empty() || m_next_ptr >= ALLOCATOR_TYPE::page_alignment);
                    return true;
                }